

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O2

string * __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::resolve_filename_abi_cxx11_
          (string *__return_storage_ptr__,dwarf_resolver *this,die_object *cu_die,
          Dwarf_Unsigned file_i)

{
  source_location location;
  source_location location_00;
  cache_mode cVar1;
  int iVar2;
  skeleton_info *psVar3;
  Dwarf_Error pDVar4;
  _Node_iterator_base<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false>
  _Var5;
  optional<cpptrace::detail::libdwarf::skeleton_info,_0> *this_00;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false,_false>,_bool>
  pVar6;
  char **in_stack_ffffffffffffffa8;
  char **in_stack_ffffffffffffffb0;
  Dwarf_Signed local_48;
  Dwarf_Error local_40 [2];
  Dwarf_Signed local_30;
  
  while ((this->skeleton).holds_value == true) {
    this_00 = &this->skeleton;
    psVar3 = optional<cpptrace::detail::libdwarf::skeleton_info,_0>::unwrap(this_00);
    this = psVar3->resolver;
    cu_die = &optional<cpptrace::detail::libdwarf::skeleton_info,_0>::unwrap(this_00)->cu_die;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar1 = get_cache_mode();
  if (cVar1 == prioritize_memory) {
    local_40[0] = (Dwarf_Error)0x0;
    iVar2 = dwarf_srcfiles((((skeleton_info *)cu_die)->cu_die).die,
                           (char ***)&stack0xffffffffffffffa8,
                           (Dwarf_Signed *)&stack0xffffffffffffffb0,local_40);
    if (iVar2 == 1) {
      handle_dwarf_error(this->dbg,local_40[0]);
    }
    location_00._8_8_ = in_stack_ffffffffffffffb0;
    location_00.file = (char *)in_stack_ffffffffffffffa8;
    assert_impl<bool>((detail *)(ulong)(iVar2 == 0),true,0x1e5664,
                      "std::string cpptrace::detail::libdwarf::dwarf_resolver::resolve_filename(const die_object &, Dwarf_Unsigned)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                      ,location_00);
    if ((long)file_i < (long)in_stack_ffffffffffffffb0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (__return_storage_ptr__,in_stack_ffffffffffffffa8[file_i]);
    }
    dwarf_dealloc((((skeleton_info *)cu_die)->cu_die).dbg,in_stack_ffffffffffffffa8,0xf);
  }
  else {
    pDVar4 = (Dwarf_Error)die_object::get_global_offset(cu_die);
    _Var5._M_cur = (__node_type *)
                   std::
                   _Hashtable<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_std::allocator<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long_long>,_std::hash<unsigned_long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&(this->srcfiles_cache)._M_h,(key_type *)&stack0xffffffffffffffa8);
    if (_Var5._M_cur == (__node_type *)0x0) {
      local_40[0] = (Dwarf_Error)0x0;
      iVar2 = dwarf_srcfiles((((skeleton_info *)cu_die)->cu_die).die,
                             (char ***)&stack0xffffffffffffffb0,&local_48,local_40);
      if (iVar2 == 1) {
        handle_dwarf_error(this->dbg,local_40[0]);
      }
      location._8_8_ = in_stack_ffffffffffffffb0;
      location.file = (char *)pDVar4;
      assert_impl<bool>((detail *)(ulong)(iVar2 == 0),true,0x1e5664,
                        "std::string cpptrace::detail::libdwarf::dwarf_resolver::resolve_filename(const die_object &, Dwarf_Unsigned)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                        ,location);
      local_30 = local_48;
      local_40[0] = pDVar4;
      pVar6 = std::
              _Hashtable<unsigned_long_long,std::pair<unsigned_long_long_const,std::pair<char**,long_long>>,std::allocator<std::pair<unsigned_long_long_const,std::pair<char**,long_long>>>,std::__detail::_Select1st,std::equal_to<unsigned_long_long>,std::hash<unsigned_long_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<std::pair<unsigned_long_long_const,std::pair<char**,long_long>>>
                        ((_Hashtable<unsigned_long_long,std::pair<unsigned_long_long_const,std::pair<char**,long_long>>,std::allocator<std::pair<unsigned_long_long_const,std::pair<char**,long_long>>>,std::__detail::_Select1st,std::equal_to<unsigned_long_long>,std::hash<unsigned_long_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)&this->srcfiles_cache);
      _Var5._M_cur = (__node_type *)
                     pVar6.first.
                     super__Node_iterator_base<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false>
                     ._M_cur;
    }
    if ((long)file_i <
        *(long *)((long)&((_Var5._M_cur)->
                         super__Hash_node_value<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false>
                         ).
                         super__Hash_node_value_base<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>_>
                         ._M_storage._M_storage + 0x10)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (__return_storage_ptr__,
                 *(char **)(*(long *)((long)&((_Var5._M_cur)->
                                             super__Hash_node_value<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false>
                                             ).
                                             super__Hash_node_value_base<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>_>
                                             ._M_storage._M_storage + 8) + file_i * 8));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string resolve_filename(const die_object& cu_die, Dwarf_Unsigned file_i) {
            // for split-dwarf line resolution happens in the skeleton
            if(skeleton) {
                return skeleton.unwrap().resolver.resolve_filename(skeleton.unwrap().cu_die, file_i);
            }
            std::string filename;
            if(get_cache_mode() == cache_mode::prioritize_memory) {
                char** dw_srcfiles;
                Dwarf_Signed dw_filecount;
                VERIFY(wrap(dwarf_srcfiles, cu_die.get(), &dw_srcfiles, &dw_filecount) == DW_DLV_OK);
                if(Dwarf_Signed(file_i) < dw_filecount) {
                    // dwarf is using 1-indexing
                    filename = dw_srcfiles[file_i];
                }
                dwarf_dealloc(cu_die.dbg, dw_srcfiles, DW_DLA_LIST);
            } else {
                auto off = cu_die.get_global_offset();
                auto it = srcfiles_cache.find(off);
                if(it == srcfiles_cache.end()) {
                    char** dw_srcfiles;
                    Dwarf_Signed dw_filecount;
                    VERIFY(wrap(dwarf_srcfiles, cu_die.get(), &dw_srcfiles, &dw_filecount) == DW_DLV_OK);
                    it = srcfiles_cache.insert(it, {off, {dw_srcfiles, dw_filecount}});
                }
                char** dw_srcfiles = it->second.first;
                Dwarf_Signed dw_filecount = it->second.second;
                if(Dwarf_Signed(file_i) < dw_filecount) {
                    // dwarf is using 1-indexing
                    filename = dw_srcfiles[file_i];
                }
            }
            return filename;
        }